

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::decompressTexture
               (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *levelDatas,
               vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
               *levelAccesses,RenderContext *renderContext,ImageInfo *info,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int i;
  CompressedTexFormat format;
  ContextType ctxType;
  int iVar4;
  ContextInfo *this;
  long lVar5;
  long lVar6;
  TexDecompressionParams decompressParams;
  IVec3 levelPixelSize;
  IVec3 size;
  CompressedTexFormat compressedFormat;
  TextureFormat decompressedFormat;
  TexDecompressionParams local_8c;
  IVec3 local_88;
  ContextInfo *local_78;
  undefined8 local_70;
  int local_68;
  int local_60;
  int local_5c;
  int local_58;
  CompressedTexFormat local_54;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_50;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_48;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_40;
  TextureFormat local_38;
  
  local_50 = levelDatas;
  local_48 = levelAccesses;
  local_40 = data;
  format = glu::mapGLCompressedTexFormat(info->m_format);
  local_54 = format;
  local_38 = tcu::getUncompressedFormat(format);
  local_68 = (info->m_size).m_data[2];
  local_70 = *(undefined8 *)(info->m_size).m_data;
  ctxType.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  this = glu::ContextInfo::create(renderContext);
  local_8c.astcMode = ASTCMODE_LAST;
  local_78 = this;
  bVar3 = tcu::isAstcFormat(format);
  if (bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_hdr");
    if (bVar3) {
      bVar3 = tcu::isAstcSRGBFormat(format);
      if (!bVar3) {
        local_8c.astcMode = ASTCMODE_HDR;
        goto LAB_0063119c;
      }
    }
    if (!bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_ldr");
      if (!bVar2) goto LAB_0063119c;
    }
    local_8c.astcMode = ASTCMODE_LDR;
  }
LAB_0063119c:
  iVar4 = getLevelCount(info);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(local_50,(long)iVar4);
  iVar4 = getLevelCount(info);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
            (local_48,(long)iVar4);
  iVar4 = getLevelCount(info);
  if (0 < iVar4) {
    local_58 = (int)local_70;
    local_5c = local_70._4_4_;
    local_60 = local_68;
    lVar6 = 0;
    do {
      local_88.m_data[2] = 0;
      local_88.m_data[0] = 0;
      local_88.m_data[1] = 0;
      bVar1 = (byte)lVar6;
      if (info->m_target == 0x8c1a) {
        local_88.m_data[0] = local_58 >> (bVar1 & 0x1f);
        if (local_88.m_data[0] < 2) {
          local_88.m_data[0] = 1;
        }
        local_88.m_data[1] = local_5c >> (bVar1 & 0x1f);
        if (local_88.m_data[1] < 2) {
          local_88.m_data[1] = 1;
        }
        local_88.m_data[2] = local_60;
      }
      else {
        lVar5 = 0;
        do {
          iVar4 = *(int *)((long)&local_70 + lVar5 * 4) >> (bVar1 & 0x1f);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          local_88.m_data[lVar5] = iVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
      }
      decompressTextureLevel
                (&local_8c,
                 (local_50->
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar6,
                 (local_48->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar6,&local_54,&local_38,&local_88,
                 (local_40->
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar6].m_ptr);
      lVar6 = lVar6 + 1;
      iVar4 = getLevelCount(info);
    } while (lVar6 < iVar4);
  }
  if (local_78 != (ContextInfo *)0x0) {
    (*local_78->_vptr_ContextInfo[1])();
  }
  return;
}

Assistant:

void decompressTexture (vector<ArrayBuffer<deUint8> >&			levelDatas,
						vector<tcu::PixelBufferAccess>&			levelAccesses,
						glu::RenderContext&						renderContext,
						const ImageInfo&						info,
						const vector<ArrayBuffer<deUint8> >&	data)
{
	const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(info.getFormat());
	const tcu::TextureFormat		decompressedFormat	= tcu::getUncompressedFormat(compressedFormat);
	const IVec3						size				= info.getSize();
	const bool						isES32				= glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2));

	de::UniquePtr<glu::ContextInfo>	ctxInfo				(glu::ContextInfo::create(renderContext));
	tcu::TexDecompressionParams		decompressParams;

	if (tcu::isAstcFormat(compressedFormat))
	{
		if (ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_hdr") && !tcu::isAstcSRGBFormat(compressedFormat))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_HDR);
		else if (isES32 || ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR);
		else
			DE_ASSERT(false);
	}

	levelDatas.resize(getLevelCount(info));
	levelAccesses.resize(getLevelCount(info));

	for (int level = 0; level < getLevelCount(info); level++)
	{
		const IVec3					levelPixelSize	= getLevelSize(info.getTarget(), size, level);
		de::ArrayBuffer<deUint8>&	levelData		= levelDatas[level];
		tcu::PixelBufferAccess&		levelAccess		= levelAccesses[level];

		decompressTextureLevel(decompressParams, levelData, levelAccess, compressedFormat, decompressedFormat, levelPixelSize, data[level].getPtr());
	}
}